

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

void __thiscall OutputRedirect::restore(OutputRedirect *this)

{
  int iVar1;
  int __fd2;
  undefined8 *in_RDI;
  OutputRedirect *in_stack_00000020;
  
  iVar1 = fmt::v5::file::descriptor((file *)(in_RDI + 1));
  if (iVar1 != -1) {
    flush(in_stack_00000020);
    iVar1 = fileno((FILE *)*in_RDI);
    fmt::v5::file::dup2((file *)(in_RDI + 1),iVar1,__fd2);
    fmt::v5::file::close((file *)(in_RDI + 1),iVar1);
  }
  return;
}

Assistant:

void OutputRedirect::restore() {
  if (original_.descriptor() == -1)
    return;  // Already restored.
  flush();
  // Restore the original file.
  original_.dup2(FMT_POSIX(fileno(file_)));
  original_.close();
}